

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int64_t GmfOpenMesh(char *FilNam,int mod,...)

{
  __jmp_buf_tag *__env;
  char *__dest;
  double *pdVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  GmfMshSct *msh;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  long lVar8;
  long lVar9;
  ushort **ppuVar10;
  int64_t pos;
  int *in_RCX;
  int *in_RDX;
  uint uStack_930;
  va_list VarArg;
  int local_8d8;
  int local_8d0;
  int local_838 [256];
  int KwdCod;
  
  msh = (GmfMshSct *)calloc(1,0x303710);
  if (msh == (GmfMshSct *)0x0) {
    return 0;
  }
  __env = msh->err;
  iVar3 = _setjmp((__jmp_buf_tag *)__env);
  if (iVar3 != 0) {
    if ((FILE *)msh->hdl != (FILE *)0x0) {
      fclose((FILE *)msh->hdl);
    }
    if (msh->FilDes != 0) {
      close(msh->FilDes);
    }
LAB_001069eb:
    free(msh);
    return 0;
  }
  sVar5 = strlen(FilNam);
  if (sVar5 - 0x3f9 < 0xfffffffffffffc00) {
    uStack_930 = -4;
    goto LAB_00106fd7;
  }
  __dest = msh->FilNam;
  strcpy(__dest,FilNam);
  msh->mod = mod;
  pdVar1 = msh->DblBuf;
  msh->buf = (char *)pdVar1;
  msh->FltBuf = (float *)pdVar1;
  msh->IntBuf = (int *)pdVar1;
  pcVar6 = strstr(__dest,".meshb");
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strstr(__dest,".mesh");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strstr(__dest,".solb");
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strstr(__dest,".sol");
        if (pcVar6 == (char *)0x0) {
          uStack_930 = -5;
          goto LAB_00106fd7;
        }
        uStack_930 = 9;
      }
      else {
        uStack_930 = 10;
      }
    }
    else {
      uStack_930 = 5;
    }
  }
  else {
    uStack_930 = 6;
  }
  msh->typ = msh->typ | uStack_930;
  if (mod == 2) {
    msh->cod = 1;
    local_8d8 = (int)in_RDX;
    msh->ver = local_8d8;
    local_8d0 = (int)in_RCX;
    msh->dim = local_8d0;
    if (msh->ver - 5U < 0xfffffffc) {
      uStack_930 = -0x12;
LAB_00106fd7:
      longjmp((__jmp_buf_tag *)__env,uStack_930);
    }
    if ((msh->dim & 0xfffffffeU) != 2) {
      uStack_930 = -0x14;
      goto LAB_00106fd7;
    }
    msh->FltSiz = (uint)(msh->ver != 1) * 0x20 + 0x20;
    iVar3 = msh->typ;
    pFVar7 = fopen(__dest,"wb");
    msh->hdl = (FILE *)pFVar7;
    if ((iVar3 & 2) == 0) {
      if (pFVar7 == (FILE *)0x0) {
        uStack_930 = -0x17;
        goto LAB_00106fd7;
      }
    }
    else if (pFVar7 == (FILE *)0x0) {
      uStack_930 = -0x16;
      goto LAB_00106fd7;
    }
    if ((msh->typ & 1) == 0) {
      RecWrd(msh,&msh->cod);
      RecWrd(msh,&msh->ver);
      GmfSetKwd((int64_t)msh,3,0);
      RecWrd(msh,msh);
    }
    else {
      fprintf(pFVar7,"%s %d\n\n",GmfKwdFmt[1][0],(ulong)(uint)msh->ver);
      fprintf((FILE *)msh->hdl,"%s\n%d\n",GmfKwdFmt[3][0],(ulong)(uint)msh->dim);
    }
    goto LAB_00106f58;
  }
  if (mod != 1) goto LAB_001069eb;
  iVar3 = msh->typ;
  pFVar7 = fopen(__dest,"rb");
  msh->hdl = (FILE *)pFVar7;
  if ((iVar3 & 2) == 0) {
    if (pFVar7 == (FILE *)0x0) {
      uStack_930 = -0xd;
      goto LAB_00106f8e;
    }
    do {
      iVar3 = __isoc99_fscanf(msh->hdl,"%100s",&KwdCod);
      if (iVar3 == -1) {
        uStack_930 = -0xe;
        goto LAB_00106f8e;
      }
      iVar3 = bcmp(&KwdCod,"MeshVersionFormatted",0x15);
    } while (iVar3 != 0);
    iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->ver);
    if (iVar3 == 1) {
      if (msh->ver - 5U < 0xfffffffc) {
        uStack_930 = -0xf;
        goto LAB_00106f8e;
      }
      do {
        iVar3 = __isoc99_fscanf(msh->hdl,"%100s",&KwdCod);
        if (iVar3 == -1) {
          uStack_930 = -0x10;
          goto LAB_00106f8e;
        }
        iVar3 = bcmp(&KwdCod,"Dimension",10);
      } while (iVar3 != 0);
      iVar3 = __isoc99_fscanf(msh->hdl,"%d",msh);
      if (iVar3 == 1) goto LAB_00106c55;
    }
    uStack_930 = -1;
  }
  else {
    if (pFVar7 == (FILE *)0x0) {
      uStack_930 = -8;
      goto LAB_00106f8e;
    }
    sVar5 = fread(&msh->cod,4,1,pFVar7);
    if (sVar5 != 1) {
      uStack_930 = -3;
      goto LAB_00106f8e;
    }
    iVar3 = msh->cod;
    if ((iVar3 != 1) && (iVar3 != 0x1000000)) {
      uStack_930 = -9;
      goto LAB_00106f8e;
    }
    ScaWrd(msh,&msh->ver);
    if (msh->ver - 5U < 0xfffffffc) {
      uStack_930 = -10;
      goto LAB_00106f8e;
    }
    ScaWrd(msh,&KwdCod);
    if (KwdCod != 3) {
      uStack_930 = -0xc;
      goto LAB_00106f8e;
    }
    GetPos(msh);
    ScaWrd(msh,msh);
LAB_00106c55:
    if ((msh->dim & 0xfffffffeU) == 2) {
      *in_RDX = msh->ver;
      *in_RCX = msh->dim;
      msh->FltSiz = (uint)(msh->ver != 1) * 0x20 + 0x20;
      uVar2 = msh->typ;
      if ((uVar2 & 1) == 0) {
        lVar8 = ftell((FILE *)msh->hdl);
        iVar3 = fseek((FILE *)msh->hdl,0,2);
        if ((uVar2 & 2) == 0) {
          if (iVar3 != 0) {
            uStack_930 = -0x22;
            goto LAB_00106f8e;
          }
          lVar9 = ftell((FILE *)msh->hdl);
          iVar3 = fseek((FILE *)msh->hdl,lVar8,0);
          if (iVar3 != 0) {
            uStack_930 = -0x23;
            goto LAB_00106f8e;
          }
        }
        else {
          if (iVar3 != 0) {
            uStack_930 = -0x20;
            goto LAB_00106f8e;
          }
          lVar9 = ftell((FILE *)msh->hdl);
          iVar3 = fseek((FILE *)msh->hdl,lVar8,0);
          if (iVar3 != 0) {
            uStack_930 = -0x21;
            goto LAB_00106f8e;
          }
        }
        lVar8 = -1;
        do {
          ScaWrd(msh,local_838);
          pos = GetPos(msh);
          iVar3 = local_838[0];
          if (lVar9 < pos) {
            uStack_930 = -0x18;
            goto LAB_00106f8e;
          }
          if (pos <= lVar8 && pos != 0) {
            uStack_930 = -0x1e;
            goto LAB_00106f8e;
          }
          if (local_838[0] - 1U < 0xf0) {
            ScaKwdHdr(msh,local_838[0]);
          }
          if (pos == 0) break;
          iVar4 = SetFilPos(msh,pos);
          if (iVar4 == 0) {
            uStack_930 = -0x19;
            goto LAB_00106f8e;
          }
          lVar8 = pos;
        } while (iVar3 != 0x36);
      }
      else {
LAB_00106d29:
        iVar3 = __isoc99_fscanf(msh->hdl,"%100s",local_838);
        if (iVar3 != -1) {
          ppuVar10 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar10 + (long)(char)local_838[0] * 2 + 1) & 4) == 0) {
            if ((char)local_838[0] == '#') {
              do {
                iVar3 = fgetc((FILE *)msh->hdl);
                if (iVar3 == -1) break;
              } while (iVar3 != 10);
            }
          }
          else {
            iVar3 = 1;
            for (lVar8 = 0x18; lVar8 != 0x1698; lVar8 = lVar8 + 0x18) {
              iVar4 = strcmp((char *)local_838,*(char **)((long)GmfKwdFmt[0] + lVar8));
              if (iVar4 == 0) {
                ScaKwdHdr(msh,iVar3);
                break;
              }
              iVar3 = iVar3 + 1;
            }
          }
          goto LAB_00106d29;
        }
      }
LAB_00106f58:
      msh->SolTypSiz[1] = 1;
      iVar3 = msh->dim;
      msh->SolTypSiz[2] = iVar3;
      msh->SolTypSiz[3] = (iVar3 + -1) * iVar3;
      msh->SolTypSiz[4] = iVar3 * iVar3;
      return (int64_t)msh;
    }
    uStack_930 = -0x11;
  }
LAB_00106f8e:
  longjmp((__jmp_buf_tag *)__env,uStack_930);
}

Assistant:

int64_t GmfOpenMesh(const char *FilNam, int mod, ...)
{
   int      KwdCod, res, *PtrVer, *PtrDim, err;
   int64_t  MshIdx;
   char     str[ GmfStrSiz ];
   va_list  VarArg;
   GmfMshSct *msh;

   /*---------------------*/
   /* MESH STRUCTURE INIT */
   /*---------------------*/

   if(!(msh = calloc(1, sizeof(GmfMshSct))))
      return(0);

   MshIdx = (int64_t)msh;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(msh->hdl != NULL)
         fclose(msh->hdl);

      if(msh->FilDes != 0)
#ifdef GMF_WINDOWS
         _close(msh->FilDes);
#else
         close(msh->FilDes);
#endif

      free(msh);
      return(0);
   }

   // Copy the FilNam into the structure
   if(strlen(FilNam) + 7 >= GmfStrSiz)
      longjmp(msh->err, -4);

   strcpy(msh->FilNam, FilNam);

   // Store the opening mod (read or write) and guess
   // the filetype (binary or ascii) depending on the extension
   msh->mod = mod;
   msh->buf = (void *)msh->DblBuf;
   msh->FltBuf = (void *)msh->DblBuf;
   msh->IntBuf = (void *)msh->DblBuf;

   if(strstr(msh->FilNam, ".meshb"))
      msh->typ |= (Bin | MshFil);
   else if(strstr(msh->FilNam, ".mesh"))
      msh->typ |= (Asc | MshFil);
   else if(strstr(msh->FilNam, ".solb"))
      msh->typ |= (Bin | SolFil);
   else if(strstr(msh->FilNam, ".sol"))
      msh->typ |= (Asc | SolFil);
   else
      longjmp(msh->err, -5);

   // Open the file in the required mod and initialize the mesh structure
   if(msh->mod == GmfRead)
   {

      /*-----------------------*/
      /* OPEN FILE FOR READING */
      /*-----------------------*/

      va_start(VarArg, mod);
      PtrVer = va_arg(VarArg, int *);
      PtrDim = va_arg(VarArg, int *);
      va_end(VarArg);

      // Read the endian coding tag, the mesh version
      // and the mesh dimension (mandatory kwd)
      if(msh->typ & Bin)
      {
         // Create the name string and open the file
#ifdef WITH_GMF_AIO
         // [Bruno] added binary flag (necessary under Windows)
         msh->FilDes = open(msh->FilNam, OPEN_READ_FLAGS, OPEN_READ_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -6);

         // Read the endian coding tag
         if(read(msh->FilDes, &msh->cod, WrdSiz) != WrdSiz)
            longjmp(msh->err, -7);
#else
         // [Bruno] added binary flag (necessary under Windows)
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -8);

         // Read the endian coding tag
         safe_fread(&msh->cod, WrdSiz, 1, msh->hdl, msh->err);
#endif

         // Read the mesh version and the mesh dimension (mandatory kwd)
         if( (msh->cod != 1) && (msh->cod != 16777216) )
            longjmp(msh->err, -9);

         ScaWrd(msh, (unsigned char *)&msh->ver);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -10);

         if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
            longjmp(msh->err, -11);

         ScaWrd(msh, (unsigned char *)&KwdCod);

         if(KwdCod != GmfDimension)
            longjmp(msh->err, -12);

         GetPos(msh);
         ScaWrd(msh, (unsigned char *)&msh->dim);
      }
      else
      {
         // Create the name string and open the file
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -13);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "MeshVersionFormatted") );

         if(res == EOF)
            longjmp(msh->err, -14);

         safe_fscanf(msh->hdl, "%d", &msh->ver, msh->err);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -15);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "Dimension") );

         if(res == EOF)
            longjmp(msh->err, -16);

         safe_fscanf(msh->hdl, "%d", &msh->dim, msh->err);
      }

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -17);

      (*PtrVer) = msh->ver;
      (*PtrDim) = msh->dim;

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      /*------------*/
      /* KW READING */
      /*------------*/

      // Read the list of kw present in the file
      if(!ScaKwdTab(msh))
         return(0);

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else if(msh->mod == GmfWrite)
   {

      /*-----------------------*/
      /* OPEN FILE FOR WRITING */
      /*-----------------------*/

      msh->cod = 1;

      // Check if the user provided a valid version number and dimension
      va_start(VarArg, mod);
      msh->ver = va_arg(VarArg, int);
      msh->dim = va_arg(VarArg, int);
      va_end(VarArg);

      if( (msh->ver < 1) || (msh->ver > 4) )
         longjmp(msh->err, -18);

      if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
         longjmp(msh->err, -19);

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -20);

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      // Create the mesh file
      if(msh->typ & Bin) 
      {
         /* 
          * [Bruno] replaced previous call to creat():
          * with a call to open(), because Windows needs the
          * binary flag to be specified.
          */
#ifdef WITH_GMF_AIO
         msh->FilDes = open(msh->FilNam, OPEN_WRITE_FLAGS, OPEN_WRITE_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -21);
#else
         if(!(msh->hdl = fopen(msh->FilNam, "wb")))
            longjmp(msh->err, -22);
#endif
      }
      else if(!(msh->hdl = fopen(msh->FilNam, "wb")))
         longjmp(msh->err, -23);


      /*------------*/
      /* KW WRITING */
      /*------------*/

      // Write the mesh version and dimension
      if(msh->typ & Asc)
      {
         fprintf(msh->hdl, "%s %d\n\n",
               GmfKwdFmt[ GmfVersionFormatted ][0], msh->ver);
         fprintf(msh->hdl, "%s\n%d\n",
               GmfKwdFmt[ GmfDimension ][0], msh->dim);
      }
      else
      {
         RecWrd(msh, (unsigned char *)&msh->cod);
         RecWrd(msh, (unsigned char *)&msh->ver);
         GmfSetKwd(MshIdx, GmfDimension, 0);
         RecWrd(msh, (unsigned char *)&msh->dim);
      }

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else
   {
      free(msh);
      return(0);
   }
}